

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

int wally_hex_n_verify(char *hex,size_t hex_len)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sStack_20;
  char c;
  size_t hex_len_local;
  char *hex_local;
  
  if (((hex != (char *)0x0) && (hex_len != 0)) &&
     (sStack_20 = hex_len, hex_len_local = (size_t)hex, (hex_len & 1) == 0)) {
    do {
      sVar2 = sStack_20 - 1;
      if (sStack_20 == 0) {
        return 0;
      }
      sVar3 = hex_len_local + 1;
      cVar1 = *(char *)hex_len_local;
      sStack_20 = sVar2;
      hex_len_local = sVar3;
    } while (((('/' < cVar1) && (cVar1 < ':')) || (('`' < cVar1 && (cVar1 < 'g')))) ||
            (('@' < cVar1 && (cVar1 < 'G'))));
  }
  return -2;
}

Assistant:

int wally_hex_n_verify(const char *hex, size_t hex_len)
{
    if (!hex || !hex_len || hex_len & 0x1)
        return WALLY_EINVAL;

    while (hex_len--) {
        char c = *hex++;
        if (!((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')))
            return WALLY_EINVAL;
    }
    return WALLY_OK;
}